

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmodule.cpp
# Opt level: O0

Ref __thiscall trun::TestModule::TestCaseFromName(TestModule *this,string *caseName)

{
  bool bVar1;
  __type_conflict4 _Var2;
  reference psVar3;
  element_type *this_00;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Ref RVar5;
  __normal_iterator<const_std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
  local_38;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  *__range1;
  string *caseName_local;
  TestModule *this_local;
  shared_ptr<trun::TestFunc> *func;
  
  __end1 = std::
           vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
           ::begin((vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
                    *)&caseName[0xb]._M_string_length);
  local_38._M_current =
       (shared_ptr<trun::TestFunc> *)
       std::
       vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
       end((vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
            *)&caseName[0xb]._M_string_length);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                           (&__end1,&local_38), ((bVar1 ^ 0xffU) & 1) != 0) {
    psVar3 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<trun::TestFunc>::shared_ptr((shared_ptr<trun::TestFunc> *)this,psVar3);
    this_00 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    __lhs = TestFunc::CaseName_abi_cxx11_(this_00);
    _Var2 = std::operator==(__lhs,in_RDX);
    _Var4._M_pi = extraout_RDX;
    if (_Var2) goto LAB_00238d54;
    std::shared_ptr<trun::TestFunc>::~shared_ptr((shared_ptr<trun::TestFunc> *)this);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_ptr<trun::TestFunc>::shared_ptr((shared_ptr<trun::TestFunc> *)this,(nullptr_t)0x0);
  _Var4._M_pi = extraout_RDX_00;
LAB_00238d54:
  RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ref)RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestFunc::Ref TestModule::TestCaseFromName(const std::string &caseName) const {
    for (auto func: testFuncs) {
        if (func->CaseName() == caseName) {
            return func;
        }
    }
    return nullptr;
}